

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_pd_set_limits
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_limit *limit_long,
              raplcap_limit *limit_short)

{
  int iVar1;
  raplcap_msr *ctx;
  off_t msr_00;
  off_t msr;
  raplcap_msr *state;
  uint64_t msrval;
  raplcap_limit *limit_short_local;
  raplcap_limit *limit_long_local;
  uint32_t local_20;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  msrval = (uint64_t)limit_short;
  limit_short_local = limit_long;
  limit_long_local._4_4_ = zone;
  local_20 = die;
  zone_local = pkg;
  _die_local = rc;
  ctx = get_state(rc,pkg,die);
  msr_00 = zone_to_msr_offset(limit_long_local._4_4_,ZONE_OFFSETS_PL);
  if (((ctx != (raplcap_msr *)0x0) && (-1 < msr_00)) &&
     (iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,local_20,msr_00), iVar1 == 0)) {
    state = (raplcap_msr *)
            msr_set_limits(&ctx->ctx,limit_long_local._4_4_,(uint64_t)state,limit_short_local,
                           (raplcap_limit *)msrval);
    iVar1 = msr_sys_write(ctx->sys,(uint64_t)state,zone_local,local_20,msr_00);
    return iVar1;
  }
  return -1;
}

Assistant:

int raplcap_pd_set_limits(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                          const raplcap_limit* limit_long, const raplcap_limit* limit_short) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_pd_set_limits: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msrval = msr_set_limits(&state->ctx, zone, msrval, limit_long, limit_short);
  return msr_sys_write(state->sys, msrval, pkg, die, msr);
}